

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O1

void av1_quantize_lp_sse2
               (int16_t *coeff_ptr,intptr_t n_coeffs,int16_t *round_ptr,int16_t *quant_ptr,
               int16_t *qcoeff_ptr,int16_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,
               int16_t *scan,int16_t *iscan)

{
  long lVar1;
  int16_t *piVar2;
  short *psVar3;
  short *psVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  short sVar12;
  ushort uVar13;
  short sVar15;
  ushort uVar16;
  short sVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar20;
  short sVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  undefined1 auVar14 [16];
  short sVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar36;
  short sVar37;
  ushort uVar38;
  ushort uVar39;
  short sVar40;
  ushort uVar41;
  ushort uVar42;
  short sVar43;
  ushort uVar44;
  ushort uVar45;
  short sVar46;
  ushort uVar47;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  short sVar48;
  ushort uVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  
  auVar14 = *(undefined1 (*) [16])round_ptr;
  auVar10._0_8_ = auVar14._8_8_;
  auVar10._8_4_ = auVar14._8_4_;
  auVar10._12_4_ = auVar14._12_4_;
  auVar32 = *(undefined1 (*) [16])quant_ptr;
  auVar11._0_8_ = auVar32._8_8_;
  auVar11._8_4_ = auVar32._8_4_;
  auVar11._12_4_ = auVar32._12_4_;
  sVar50 = *dequant_ptr;
  sVar51 = dequant_ptr[1];
  sVar52 = dequant_ptr[2];
  sVar53 = dequant_ptr[3];
  sVar5 = dequant_ptr[4];
  sVar6 = dequant_ptr[5];
  sVar7 = dequant_ptr[6];
  sVar8 = dequant_ptr[7];
  auVar59 = *(undefined1 (*) [16])coeff_ptr;
  auVar31 = *(undefined1 (*) [16])(coeff_ptr + 8);
  sVar29 = auVar59._0_2_;
  sVar12 = -sVar29;
  sVar33 = auVar59._2_2_;
  sVar15 = -sVar33;
  sVar35 = auVar59._4_2_;
  sVar17 = -sVar35;
  sVar37 = auVar59._6_2_;
  sVar19 = -sVar37;
  sVar40 = auVar59._8_2_;
  sVar21 = -sVar40;
  sVar43 = auVar59._10_2_;
  sVar23 = -sVar43;
  sVar46 = auVar59._12_2_;
  sVar25 = -sVar46;
  sVar48 = auVar59._14_2_;
  sVar27 = -sVar48;
  auVar61._0_2_ = (ushort)(sVar12 < sVar29) * sVar29 | (ushort)(sVar12 >= sVar29) * sVar12;
  auVar61._2_2_ = (ushort)(sVar15 < sVar33) * sVar33 | (ushort)(sVar15 >= sVar33) * sVar15;
  auVar61._4_2_ = (ushort)(sVar17 < sVar35) * sVar35 | (ushort)(sVar17 >= sVar35) * sVar17;
  auVar61._6_2_ = (ushort)(sVar19 < sVar37) * sVar37 | (ushort)(sVar19 >= sVar37) * sVar19;
  auVar61._8_2_ = (ushort)(sVar21 < sVar40) * sVar40 | (ushort)(sVar21 >= sVar40) * sVar21;
  auVar61._10_2_ = (ushort)(sVar23 < sVar43) * sVar43 | (ushort)(sVar23 >= sVar43) * sVar23;
  auVar61._12_2_ = (ushort)(sVar25 < sVar46) * sVar46 | (ushort)(sVar25 >= sVar46) * sVar25;
  auVar61._14_2_ = (ushort)(sVar27 < sVar48) * sVar48 | (ushort)(sVar27 >= sVar48) * sVar27;
  auVar60 = psraw(auVar59,0xf);
  sVar29 = auVar31._0_2_;
  sVar12 = -sVar29;
  sVar33 = auVar31._2_2_;
  sVar15 = -sVar33;
  sVar35 = auVar31._4_2_;
  sVar17 = -sVar35;
  sVar37 = auVar31._6_2_;
  sVar19 = -sVar37;
  sVar40 = auVar31._8_2_;
  sVar21 = -sVar40;
  sVar43 = auVar31._10_2_;
  sVar23 = -sVar43;
  sVar46 = auVar31._12_2_;
  sVar25 = -sVar46;
  sVar48 = auVar31._14_2_;
  sVar27 = -sVar48;
  auVar59._0_2_ = (ushort)(sVar12 < sVar29) * sVar29 | (ushort)(sVar12 >= sVar29) * sVar12;
  auVar59._2_2_ = (ushort)(sVar15 < sVar33) * sVar33 | (ushort)(sVar15 >= sVar33) * sVar15;
  auVar59._4_2_ = (ushort)(sVar17 < sVar35) * sVar35 | (ushort)(sVar17 >= sVar35) * sVar17;
  auVar59._6_2_ = (ushort)(sVar19 < sVar37) * sVar37 | (ushort)(sVar19 >= sVar37) * sVar19;
  auVar59._8_2_ = (ushort)(sVar21 < sVar40) * sVar40 | (ushort)(sVar21 >= sVar40) * sVar21;
  auVar59._10_2_ = (ushort)(sVar23 < sVar43) * sVar43 | (ushort)(sVar23 >= sVar43) * sVar23;
  auVar59._12_2_ = (ushort)(sVar25 < sVar46) * sVar46 | (ushort)(sVar25 >= sVar46) * sVar25;
  auVar59._14_2_ = (ushort)(sVar27 < sVar48) * sVar48 | (ushort)(sVar27 >= sVar48) * sVar27;
  auVar62 = psraw(auVar31,0xf);
  auVar31 = paddsw(auVar61,auVar14);
  auVar14 = paddsw(auVar59,auVar10);
  auVar32 = pmulhw(auVar31,auVar32);
  auVar14 = pmulhw(auVar14,auVar11);
  auVar32 = auVar32 ^ auVar60;
  auVar14 = auVar14 ^ auVar62;
  sVar29 = auVar32._0_2_ - auVar60._0_2_;
  sVar33 = auVar32._2_2_ - auVar60._2_2_;
  sVar35 = auVar32._4_2_ - auVar60._4_2_;
  sVar37 = auVar32._6_2_ - auVar60._6_2_;
  sVar40 = auVar32._8_2_ - auVar60._8_2_;
  sVar43 = auVar32._10_2_ - auVar60._10_2_;
  sVar46 = auVar32._12_2_ - auVar60._12_2_;
  sVar48 = auVar32._14_2_ - auVar60._14_2_;
  sVar12 = auVar14._0_2_ - auVar62._0_2_;
  sVar15 = auVar14._2_2_ - auVar62._2_2_;
  sVar17 = auVar14._4_2_ - auVar62._4_2_;
  sVar19 = auVar14._6_2_ - auVar62._6_2_;
  sVar21 = auVar14._8_2_ - auVar62._8_2_;
  sVar23 = auVar14._10_2_ - auVar62._10_2_;
  sVar25 = auVar14._12_2_ - auVar62._12_2_;
  sVar27 = auVar14._14_2_ - auVar62._14_2_;
  *qcoeff_ptr = sVar29;
  qcoeff_ptr[1] = sVar33;
  qcoeff_ptr[2] = sVar35;
  qcoeff_ptr[3] = sVar37;
  qcoeff_ptr[4] = sVar40;
  qcoeff_ptr[5] = sVar43;
  qcoeff_ptr[6] = sVar46;
  qcoeff_ptr[7] = sVar48;
  qcoeff_ptr[8] = sVar12;
  qcoeff_ptr[9] = sVar15;
  qcoeff_ptr[10] = sVar17;
  qcoeff_ptr[0xb] = sVar19;
  qcoeff_ptr[0xc] = sVar21;
  qcoeff_ptr[0xd] = sVar23;
  qcoeff_ptr[0xe] = sVar25;
  qcoeff_ptr[0xf] = sVar27;
  sVar29 = sVar29 * sVar50;
  sVar33 = sVar33 * sVar51;
  sVar35 = sVar35 * sVar52;
  sVar37 = sVar37 * sVar53;
  sVar40 = sVar40 * sVar5;
  sVar43 = sVar43 * sVar6;
  sVar46 = sVar46 * sVar7;
  sVar48 = sVar48 * sVar8;
  sVar12 = sVar12 * sVar5;
  sVar15 = sVar15 * sVar6;
  sVar17 = sVar17 * sVar7;
  sVar19 = sVar19 * sVar8;
  sVar21 = sVar21 * sVar5;
  sVar23 = sVar23 * sVar6;
  sVar25 = sVar25 * sVar7;
  sVar27 = sVar27 * sVar8;
  *dqcoeff_ptr = sVar29;
  dqcoeff_ptr[1] = sVar33;
  dqcoeff_ptr[2] = sVar35;
  dqcoeff_ptr[3] = sVar37;
  dqcoeff_ptr[4] = sVar40;
  dqcoeff_ptr[5] = sVar43;
  dqcoeff_ptr[6] = sVar46;
  dqcoeff_ptr[7] = sVar48;
  dqcoeff_ptr[8] = sVar12;
  dqcoeff_ptr[9] = sVar15;
  dqcoeff_ptr[10] = sVar17;
  dqcoeff_ptr[0xb] = sVar19;
  dqcoeff_ptr[0xc] = sVar21;
  dqcoeff_ptr[0xd] = sVar23;
  dqcoeff_ptr[0xe] = sVar25;
  dqcoeff_ptr[0xf] = sVar27;
  uVar30 = -(ushort)(sVar29 == 0);
  uVar34 = -(ushort)(sVar33 == 0);
  uVar36 = -(ushort)(sVar35 == 0);
  uVar38 = -(ushort)(sVar37 == 0);
  uVar41 = -(ushort)(sVar40 == 0);
  uVar44 = -(ushort)(sVar43 == 0);
  uVar47 = -(ushort)(sVar46 == 0);
  uVar49 = -(ushort)(sVar48 == 0);
  uVar13 = -(ushort)(sVar12 == 0);
  uVar16 = -(ushort)(sVar15 == 0);
  uVar18 = -(ushort)(sVar17 == 0);
  uVar20 = -(ushort)(sVar19 == 0);
  uVar22 = -(ushort)(sVar21 == 0);
  uVar24 = -(ushort)(sVar23 == 0);
  uVar26 = -(ushort)(sVar25 == 0);
  uVar28 = -(ushort)(sVar27 == 0);
  uVar39 = ~uVar30 & *iscan + uVar30 + 1;
  uVar42 = ~uVar34 & iscan[1] + uVar34 + 1;
  uVar45 = ~uVar36 & iscan[2] + uVar36 + 1;
  uVar38 = ~uVar38 & iscan[3] + uVar38 + 1;
  uVar41 = ~uVar41 & iscan[4] + uVar41 + 1;
  uVar44 = ~uVar44 & iscan[5] + uVar44 + 1;
  uVar47 = ~uVar47 & iscan[6] + uVar47 + 1;
  uVar49 = ~uVar49 & iscan[7] + uVar49 + 1;
  uVar13 = ~uVar13 & iscan[8] + uVar13 + 1;
  uVar30 = ~uVar16 & iscan[9] + uVar16 + 1;
  uVar18 = ~uVar18 & iscan[10] + uVar18 + 1;
  uVar20 = ~uVar20 & iscan[0xb] + uVar20 + 1;
  uVar22 = ~uVar22 & iscan[0xc] + uVar22 + 1;
  uVar34 = ~uVar24 & iscan[0xd] + uVar24 + 1;
  uVar36 = ~uVar26 & iscan[0xe] + uVar26 + 1;
  uVar28 = ~uVar28 & iscan[0xf] + uVar28 + 1;
  uVar16 = ((short)uVar13 < (short)uVar39) * uVar39 | ((short)uVar13 >= (short)uVar39) * uVar13;
  uVar13 = ((short)uVar30 < (short)uVar42) * uVar42 | ((short)uVar30 >= (short)uVar42) * uVar30;
  uVar26 = ((short)uVar18 < (short)uVar45) * uVar45 | ((short)uVar18 >= (short)uVar45) * uVar18;
  uVar24 = ((short)uVar20 < (short)uVar38) * uVar38 | ((short)uVar20 >= (short)uVar38) * uVar20;
  uVar22 = ((short)uVar22 < (short)uVar41) * uVar41 | ((short)uVar22 >= (short)uVar41) * uVar22;
  uVar20 = ((short)uVar34 < (short)uVar44) * uVar44 | ((short)uVar34 >= (short)uVar44) * uVar34;
  uVar18 = ((short)uVar36 < (short)uVar47) * uVar47 | ((short)uVar36 >= (short)uVar47) * uVar36;
  uVar30 = ((short)uVar28 < (short)uVar49) * uVar49 | ((short)uVar28 >= (short)uVar49) * uVar28;
  uVar16 = (-1 < (short)uVar16) * uVar16;
  uVar13 = (-1 < (short)uVar13) * uVar13;
  uVar26 = (-1 < (short)uVar26) * uVar26;
  uVar24 = (-1 < (short)uVar24) * uVar24;
  uVar22 = (-1 < (short)uVar22) * uVar22;
  uVar20 = (-1 < (short)uVar20) * uVar20;
  uVar18 = (-1 < (short)uVar18) * uVar18;
  uVar30 = (-1 < (short)uVar30) * uVar30;
  if (0x10 - n_coeffs < 0) {
    lVar9 = 0;
    do {
      auVar14 = *(undefined1 (*) [16])(coeff_ptr + lVar9 + 0x10);
      auVar32 = *(undefined1 (*) [16])(coeff_ptr + lVar9 + 0x18);
      sVar50 = auVar14._0_2_;
      sVar12 = -sVar50;
      sVar51 = auVar14._2_2_;
      sVar15 = -sVar51;
      sVar52 = auVar14._4_2_;
      sVar17 = -sVar52;
      sVar53 = auVar14._6_2_;
      sVar19 = -sVar53;
      sVar29 = auVar14._8_2_;
      sVar21 = -sVar29;
      sVar33 = auVar14._10_2_;
      sVar23 = -sVar33;
      sVar35 = auVar14._12_2_;
      sVar25 = -sVar35;
      sVar37 = auVar14._14_2_;
      sVar27 = -sVar37;
      auVar31._0_2_ = (ushort)(sVar12 < sVar50) * sVar50 | (ushort)(sVar12 >= sVar50) * sVar12;
      auVar31._2_2_ = (ushort)(sVar15 < sVar51) * sVar51 | (ushort)(sVar15 >= sVar51) * sVar15;
      auVar31._4_2_ = (ushort)(sVar17 < sVar52) * sVar52 | (ushort)(sVar17 >= sVar52) * sVar17;
      auVar31._6_2_ = (ushort)(sVar19 < sVar53) * sVar53 | (ushort)(sVar19 >= sVar53) * sVar19;
      auVar31._8_2_ = (ushort)(sVar21 < sVar29) * sVar29 | (ushort)(sVar21 >= sVar29) * sVar21;
      auVar31._10_2_ = (ushort)(sVar23 < sVar33) * sVar33 | (ushort)(sVar23 >= sVar33) * sVar23;
      auVar31._12_2_ = (ushort)(sVar25 < sVar35) * sVar35 | (ushort)(sVar25 >= sVar35) * sVar25;
      auVar31._14_2_ = (ushort)(sVar27 < sVar37) * sVar37 | (ushort)(sVar27 >= sVar37) * sVar27;
      auVar61 = psraw(auVar14,0xf);
      sVar50 = auVar32._0_2_;
      sVar12 = -sVar50;
      sVar51 = auVar32._2_2_;
      sVar15 = -sVar51;
      sVar52 = auVar32._4_2_;
      sVar17 = -sVar52;
      sVar53 = auVar32._6_2_;
      sVar19 = -sVar53;
      sVar29 = auVar32._8_2_;
      sVar21 = -sVar29;
      sVar33 = auVar32._10_2_;
      sVar23 = -sVar33;
      sVar35 = auVar32._12_2_;
      sVar25 = -sVar35;
      sVar37 = auVar32._14_2_;
      sVar27 = -sVar37;
      auVar60._0_2_ = (ushort)(sVar12 < sVar50) * sVar50 | (ushort)(sVar12 >= sVar50) * sVar12;
      auVar60._2_2_ = (ushort)(sVar15 < sVar51) * sVar51 | (ushort)(sVar15 >= sVar51) * sVar15;
      auVar60._4_2_ = (ushort)(sVar17 < sVar52) * sVar52 | (ushort)(sVar17 >= sVar52) * sVar17;
      auVar60._6_2_ = (ushort)(sVar19 < sVar53) * sVar53 | (ushort)(sVar19 >= sVar53) * sVar19;
      auVar60._8_2_ = (ushort)(sVar21 < sVar29) * sVar29 | (ushort)(sVar21 >= sVar29) * sVar21;
      auVar60._10_2_ = (ushort)(sVar23 < sVar33) * sVar33 | (ushort)(sVar23 >= sVar33) * sVar23;
      auVar60._12_2_ = (ushort)(sVar25 < sVar35) * sVar35 | (ushort)(sVar25 >= sVar35) * sVar25;
      auVar60._14_2_ = (ushort)(sVar27 < sVar37) * sVar37 | (ushort)(sVar27 >= sVar37) * sVar27;
      auVar59 = psraw(auVar32,0xf);
      auVar14 = paddsw(auVar31,auVar10);
      auVar32 = paddsw(auVar60,auVar10);
      auVar14 = pmulhw(auVar14,auVar11);
      auVar32 = pmulhw(auVar32,auVar11);
      auVar14 = auVar14 ^ auVar61;
      auVar32 = auVar32 ^ auVar59;
      sVar12 = auVar14._0_2_ - auVar61._0_2_;
      sVar15 = auVar14._2_2_ - auVar61._2_2_;
      sVar17 = auVar14._4_2_ - auVar61._4_2_;
      sVar19 = auVar14._6_2_ - auVar61._6_2_;
      sVar21 = auVar14._8_2_ - auVar61._8_2_;
      sVar23 = auVar14._10_2_ - auVar61._10_2_;
      sVar25 = auVar14._12_2_ - auVar61._12_2_;
      sVar27 = auVar14._14_2_ - auVar61._14_2_;
      sVar50 = auVar32._0_2_ - auVar59._0_2_;
      sVar51 = auVar32._2_2_ - auVar59._2_2_;
      sVar52 = auVar32._4_2_ - auVar59._4_2_;
      sVar53 = auVar32._6_2_ - auVar59._6_2_;
      sVar29 = auVar32._8_2_ - auVar59._8_2_;
      sVar33 = auVar32._10_2_ - auVar59._10_2_;
      sVar35 = auVar32._12_2_ - auVar59._12_2_;
      sVar37 = auVar32._14_2_ - auVar59._14_2_;
      piVar2 = qcoeff_ptr + lVar9 + 0x10;
      *piVar2 = sVar12;
      piVar2[1] = sVar15;
      piVar2[2] = sVar17;
      piVar2[3] = sVar19;
      piVar2[4] = sVar21;
      piVar2[5] = sVar23;
      piVar2[6] = sVar25;
      piVar2[7] = sVar27;
      piVar2 = qcoeff_ptr + lVar9 + 0x18;
      *piVar2 = sVar50;
      piVar2[1] = sVar51;
      piVar2[2] = sVar52;
      piVar2[3] = sVar53;
      piVar2[4] = sVar29;
      piVar2[5] = sVar33;
      piVar2[6] = sVar35;
      piVar2[7] = sVar37;
      sVar12 = sVar12 * sVar5;
      sVar15 = sVar15 * sVar6;
      sVar17 = sVar17 * sVar7;
      sVar19 = sVar19 * sVar8;
      sVar21 = sVar21 * sVar5;
      sVar23 = sVar23 * sVar6;
      sVar25 = sVar25 * sVar7;
      sVar27 = sVar27 * sVar8;
      sVar50 = sVar50 * sVar5;
      sVar51 = sVar51 * sVar6;
      sVar52 = sVar52 * sVar7;
      sVar53 = sVar53 * sVar8;
      sVar29 = sVar29 * sVar5;
      sVar33 = sVar33 * sVar6;
      sVar35 = sVar35 * sVar7;
      sVar37 = sVar37 * sVar8;
      piVar2 = dqcoeff_ptr + lVar9 + 0x10;
      *piVar2 = sVar12;
      piVar2[1] = sVar15;
      piVar2[2] = sVar17;
      piVar2[3] = sVar19;
      piVar2[4] = sVar21;
      piVar2[5] = sVar23;
      piVar2[6] = sVar25;
      piVar2[7] = sVar27;
      piVar2 = dqcoeff_ptr + lVar9 + 0x18;
      *piVar2 = sVar50;
      piVar2[1] = sVar51;
      piVar2[2] = sVar52;
      piVar2[3] = sVar53;
      piVar2[4] = sVar29;
      piVar2[5] = sVar33;
      piVar2[6] = sVar35;
      piVar2[7] = sVar37;
      uVar34 = -(ushort)(sVar12 == 0);
      uVar36 = -(ushort)(sVar15 == 0);
      uVar28 = -(ushort)(sVar17 == 0);
      uVar39 = -(ushort)(sVar19 == 0);
      uVar42 = -(ushort)(sVar21 == 0);
      uVar45 = -(ushort)(sVar23 == 0);
      uVar38 = -(ushort)(sVar25 == 0);
      uVar41 = -(ushort)(sVar27 == 0);
      uVar44 = -(ushort)(sVar50 == 0);
      uVar47 = -(ushort)(sVar51 == 0);
      uVar49 = -(ushort)(sVar52 == 0);
      uVar54 = -(ushort)(sVar53 == 0);
      uVar55 = -(ushort)(sVar29 == 0);
      uVar56 = -(ushort)(sVar33 == 0);
      uVar57 = -(ushort)(sVar35 == 0);
      uVar58 = -(ushort)(sVar37 == 0);
      psVar3 = iscan + lVar9 + 0x10;
      psVar4 = iscan + lVar9 + 0x18;
      uVar34 = ~uVar34 & *psVar3 + uVar34 + 1;
      uVar36 = ~uVar36 & psVar3[1] + uVar36 + 1;
      uVar28 = ~uVar28 & psVar3[2] + uVar28 + 1;
      uVar39 = ~uVar39 & psVar3[3] + uVar39 + 1;
      uVar42 = ~uVar42 & psVar3[4] + uVar42 + 1;
      uVar45 = ~uVar45 & psVar3[5] + uVar45 + 1;
      uVar38 = ~uVar38 & psVar3[6] + uVar38 + 1;
      uVar41 = ~uVar41 & psVar3[7] + uVar41 + 1;
      uVar44 = ~uVar44 & *psVar4 + uVar44 + 1;
      uVar47 = ~uVar47 & psVar4[1] + uVar47 + 1;
      uVar49 = ~uVar49 & psVar4[2] + uVar49 + 1;
      uVar54 = ~uVar54 & psVar4[3] + uVar54 + 1;
      uVar55 = ~uVar55 & psVar4[4] + uVar55 + 1;
      uVar56 = ~uVar56 & psVar4[5] + uVar56 + 1;
      uVar57 = ~uVar57 & psVar4[6] + uVar57 + 1;
      uVar58 = ~uVar58 & psVar4[7] + uVar58 + 1;
      uVar34 = ((short)uVar44 < (short)uVar34) * uVar34 | ((short)uVar44 >= (short)uVar34) * uVar44;
      uVar36 = ((short)uVar47 < (short)uVar36) * uVar36 | ((short)uVar47 >= (short)uVar36) * uVar47;
      uVar28 = ((short)uVar49 < (short)uVar28) * uVar28 | ((short)uVar49 >= (short)uVar28) * uVar49;
      uVar39 = ((short)uVar54 < (short)uVar39) * uVar39 | ((short)uVar54 >= (short)uVar39) * uVar54;
      uVar42 = ((short)uVar55 < (short)uVar42) * uVar42 | ((short)uVar55 >= (short)uVar42) * uVar55;
      uVar45 = ((short)uVar56 < (short)uVar45) * uVar45 | ((short)uVar56 >= (short)uVar45) * uVar56;
      uVar38 = ((short)uVar57 < (short)uVar38) * uVar38 | ((short)uVar57 >= (short)uVar38) * uVar57;
      uVar41 = ((short)uVar58 < (short)uVar41) * uVar41 | ((short)uVar58 >= (short)uVar41) * uVar58;
      uVar16 = ((short)uVar16 < (short)uVar34) * uVar34 | ((short)uVar16 >= (short)uVar34) * uVar16;
      uVar13 = ((short)uVar13 < (short)uVar36) * uVar36 | ((short)uVar13 >= (short)uVar36) * uVar13;
      uVar26 = ((short)uVar26 < (short)uVar28) * uVar28 | ((short)uVar26 >= (short)uVar28) * uVar26;
      uVar24 = ((short)uVar24 < (short)uVar39) * uVar39 | ((short)uVar24 >= (short)uVar39) * uVar24;
      uVar22 = ((short)uVar22 < (short)uVar42) * uVar42 | ((short)uVar22 >= (short)uVar42) * uVar22;
      uVar20 = ((short)uVar20 < (short)uVar45) * uVar45 | ((short)uVar20 >= (short)uVar45) * uVar20;
      uVar18 = ((short)uVar18 < (short)uVar38) * uVar38 | ((short)uVar18 >= (short)uVar38) * uVar18;
      uVar30 = ((short)uVar30 < (short)uVar41) * uVar41 | ((short)uVar30 >= (short)uVar41) * uVar30;
      lVar1 = lVar9 - n_coeffs;
      lVar9 = lVar9 + 0x10;
    } while (lVar1 + 0x10 < -0x10);
  }
  auVar14._0_2_ =
       ((short)uVar22 < (short)uVar16) * uVar16 | ((short)uVar22 >= (short)uVar16) * uVar22;
  auVar14._2_2_ =
       ((short)uVar20 < (short)uVar13) * uVar13 | ((short)uVar20 >= (short)uVar13) * uVar20;
  auVar14._4_2_ =
       ((short)uVar18 < (short)uVar26) * uVar26 | ((short)uVar18 >= (short)uVar26) * uVar18;
  auVar14._6_2_ =
       ((short)uVar30 < (short)uVar24) * uVar24 | ((short)uVar30 >= (short)uVar24) * uVar30;
  auVar14._8_2_ =
       ((short)uVar16 < (short)uVar22) * uVar22 | ((short)uVar16 >= (short)uVar22) * uVar16;
  auVar14._10_2_ =
       ((short)uVar13 < (short)uVar20) * uVar20 | ((short)uVar13 >= (short)uVar20) * uVar13;
  auVar14._12_2_ =
       ((short)uVar16 < (short)uVar18) * uVar18 | ((short)uVar16 >= (short)uVar18) * uVar16;
  auVar14._14_2_ =
       ((short)uVar13 < (short)uVar30) * uVar30 | ((short)uVar13 >= (short)uVar30) * uVar13;
  auVar32 = pshuflw(auVar11,auVar14,0xe);
  sVar12 = auVar32._0_2_;
  auVar62._0_2_ =
       (sVar12 < (short)auVar14._0_2_) * auVar14._0_2_ |
       (ushort)(sVar12 >= (short)auVar14._0_2_) * sVar12;
  sVar12 = auVar32._2_2_;
  auVar62._2_2_ =
       (sVar12 < (short)auVar14._2_2_) * auVar14._2_2_ |
       (ushort)(sVar12 >= (short)auVar14._2_2_) * sVar12;
  sVar12 = auVar32._4_2_;
  auVar62._4_2_ =
       (sVar12 < (short)auVar14._4_2_) * auVar14._4_2_ |
       (ushort)(sVar12 >= (short)auVar14._4_2_) * sVar12;
  sVar12 = auVar32._6_2_;
  auVar62._6_2_ =
       (sVar12 < (short)auVar14._6_2_) * auVar14._6_2_ |
       (ushort)(sVar12 >= (short)auVar14._6_2_) * sVar12;
  sVar12 = auVar32._8_2_;
  auVar62._8_2_ =
       (sVar12 < (short)auVar14._8_2_) * auVar14._8_2_ |
       (ushort)(sVar12 >= (short)auVar14._8_2_) * sVar12;
  sVar12 = auVar32._10_2_;
  auVar62._10_2_ =
       (sVar12 < (short)auVar14._10_2_) * auVar14._10_2_ |
       (ushort)(sVar12 >= (short)auVar14._10_2_) * sVar12;
  sVar12 = auVar32._12_2_;
  sVar15 = auVar32._14_2_;
  auVar62._12_2_ =
       (sVar12 < (short)auVar14._12_2_) * auVar14._12_2_ |
       (ushort)(sVar12 >= (short)auVar14._12_2_) * sVar12;
  auVar62._14_2_ =
       (sVar15 < (short)auVar14._14_2_) * auVar14._14_2_ |
       (ushort)(sVar15 >= (short)auVar14._14_2_) * sVar15;
  auVar14 = pshuflw(auVar14,auVar62,1);
  sVar12 = auVar14._2_2_;
  *eob_ptr = (sVar12 < (short)auVar62._2_2_) * auVar62._2_2_ |
             (ushort)(sVar12 >= (short)auVar62._2_2_) * sVar12;
  return;
}

Assistant:

void av1_quantize_lp_sse2(const int16_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *round_ptr, const int16_t *quant_ptr,
                          int16_t *qcoeff_ptr, int16_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  coeff_ptr += n_coeffs;
  iscan += n_coeffs;
  qcoeff_ptr += n_coeffs;
  dqcoeff_ptr += n_coeffs;
  n_coeffs = -n_coeffs;

  // Setup global values
  const __m128i round0 = _mm_load_si128((const __m128i *)round_ptr);
  const __m128i round1 = _mm_unpackhi_epi64(round0, round0);
  const __m128i quant0 = _mm_load_si128((const __m128i *)quant_ptr);
  const __m128i quant1 = _mm_unpackhi_epi64(quant0, quant0);
  const __m128i dequant0 = _mm_load_si128((const __m128i *)dequant_ptr);
  const __m128i dequant1 = _mm_unpackhi_epi64(dequant0, dequant0);
  __m128i eob = _mm_setzero_si128();

  // DC and first 15 AC
  quantize_lp(iscan, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round0,
              &round1, &quant0, &quant1, &dequant0, &dequant1, &eob);
  n_coeffs += 8 * 2;

  // AC only loop
  while (n_coeffs < 0) {
    quantize_lp(iscan, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round1,
                &round1, &quant1, &quant1, &dequant1, &dequant1, &eob);
    n_coeffs += 8 * 2;
  }

  // Accumulate EOB
  *eob_ptr = accumulate_eob(eob);
}